

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O1

BOOL __thiscall
Js::JavascriptArray::SetConfigurable(JavascriptArray *this,PropertyId propertyId,BOOL value)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  int iVar4;
  undefined4 *puVar5;
  DynamicTypeHandler *pDVar6;
  undefined4 extraout_var;
  uint32 local_24 [2];
  uint32 index;
  
  if (propertyId == 0xd1) {
    BVar3 = 1;
    if (value != 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                  ,0x3123,"(!value)","!value");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar5 = 0;
    }
  }
  else {
    BVar3 = ScriptContext::IsNumericPropertyId
                      ((((((this->super_ArrayObject).super_DynamicObject.super_RecyclableObject.type
                          .ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext
                       .ptr,propertyId,local_24);
    if (BVar3 == 0) {
      BVar3 = DynamicObject::SetConfigurable((DynamicObject *)this,propertyId,value);
    }
    else {
      pDVar6 = DynamicObject::GetTypeHandler((DynamicObject *)this);
      iVar4 = (*pDVar6->_vptr_DynamicTypeHandler[0x48])(pDVar6,this);
      BVar3 = (**(code **)(*(long *)CONCAT44(extraout_var,iVar4) + 0x158))
                        ((long *)CONCAT44(extraout_var,iVar4),this,propertyId,value);
    }
  }
  return BVar3;
}

Assistant:

BOOL JavascriptArray::SetConfigurable(PropertyId propertyId, BOOL value)
    {
        if (propertyId == PropertyIds::length)
        {
            Assert(!value); // Can't change array length configurable
            return true;
        }

        ScriptContext* scriptContext = this->GetScriptContext();

        uint32 index;
        if (scriptContext->IsNumericPropertyId(propertyId, &index))
        {
            return GetTypeHandler()->ConvertToTypeWithItemAttributes(this)
                ->SetConfigurable(this, propertyId, value);
        }

        return __super::SetConfigurable(propertyId, value);
    }